

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int nn_ws_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  int iVar1;
  nn_optset *local_40;
  int val;
  nn_ws_optset *optset;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  int local_4;
  
  local_40 = self;
  if (self == (nn_optset *)0x0) {
    local_40 = (nn_optset *)0x0;
  }
  if (optvallen == 4) {
    iVar1 = *optval;
    if (option == 1) {
      if (iVar1 == 1 || iVar1 == 2) {
        *(int *)&local_40[1].vfptr = iVar1;
        local_4 = 0;
      }
      else {
        local_4 = -0x16;
      }
    }
    else {
      local_4 = -0x5c;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

static int nn_ws_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_ws_optset *optset;
    int val;

    optset = nn_cont (self, struct nn_ws_optset, base);
    if (optvallen != sizeof (int)) {
        return -EINVAL;
    }
    val = *(int *)optval;

    switch (option) {
    case NN_WS_MSG_TYPE:
        switch (val) {
        case NN_WS_MSG_TYPE_TEXT:
        case NN_WS_MSG_TYPE_BINARY:
	    optset->msg_type = val;
            return 0;
        default:
            return -EINVAL;
        }
    default:
        return -ENOPROTOOPT;
    }
}